

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::bindReplCount
          (Compilation *comp,ExpressionSyntax *syntax,ASTContext *context,size_t *count)

{
  SourceRange range;
  optional<int> value;
  bool bVar1;
  SourceLocation SVar2;
  int *piVar3;
  long *in_RCX;
  ASTContext *in_RDX;
  Compilation *in_RSI;
  optional<int> c;
  Expression *expr;
  Expression *in_stack_00000088;
  ASTContext *in_stack_00000090;
  bitmask<slang::ast::EvalFlags> in_stack_0000009f;
  Expression *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffffb0;
  bitmask<slang::ast::EvalFlags> local_41;
  _Optional_payload_base<int> local_40;
  bitmask<slang::ast::ASTFlags> local_38;
  SourceLocation local_30;
  long *local_28;
  ASTContext *local_20;
  SourceLocation local_8;
  undefined4 extraout_var;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_38,None);
  SVar2._0_4_ = Expression::bind((int)in_RSI,(sockaddr *)in_RDX,(socklen_t)local_38.m_bits);
  SVar2._4_4_ = extraout_var;
  local_30 = SVar2;
  memset(&local_41,0,1);
  bitmask<slang::ast::EvalFlags>::bitmask(&local_41);
  local_40 = (_Optional_payload_base<int>)
             ASTContext::evalInteger(in_stack_00000090,in_stack_00000088,in_stack_0000009f);
  value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_ =
       in_stack_ffffffffffffffb0;
  value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload._M_value = (int)((ulong)*(undefined8 *)((long)local_30 + 0x28) >> 0x20);
  range.endLoc = *(SourceLocation *)((long)local_30 + 0x20);
  range.startLoc = SVar2;
  bVar1 = ASTContext::requireGtZero(local_20,value,range);
  if (bVar1) {
    piVar3 = std::optional<int>::operator*((optional<int> *)0x9c401f);
    *local_28 = (long)*piVar3;
    local_8 = local_30;
  }
  else {
    local_8 = (SourceLocation)Expression::badExpr(in_RSI,in_stack_ffffffffffffff78);
  }
  return (Expression *)local_8;
}

Assistant:

const Expression& ReplicatedAssignmentPatternExpression::bindReplCount(
    Compilation& comp, const ExpressionSyntax& syntax, const ASTContext& context, size_t& count) {

    const Expression& expr = bind(syntax, context);
    std::optional<int32_t> c = context.evalInteger(expr);
    if (!context.requireGtZero(c, expr.sourceRange))
        return badExpr(comp, &expr);

    count = size_t(*c);
    return expr;
}